

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall EOPlus::Context::Context(Context *this,Quest *quest)

{
  Quest *quest_local;
  Context *this_local;
  
  this->_vptr_Context = (_func_int **)&PTR___cxa_pure_virtual_002c5568;
  this->quest = quest;
  this->state = (State *)0x0;
  std::__cxx11::string::string((string *)&this->state_name);
  this->finished = false;
  return;
}

Assistant:

Context::Context(const Quest* quest)
		: quest(quest)
		, state(0)
		, finished(false)
	{ }